

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::ImageInfiniteLight::Le(ImageInfiniteLight *this,Point2f uv,SampledWavelengths *lambda)

{
  RGBColorSpace *cs;
  undefined1 auVar1 [16];
  RGB *pRVar2;
  int c;
  int c_00;
  Float FVar3;
  undefined1 auVar6 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined8 in_XMM1_Qb;
  RGB RVar7;
  SampledSpectrum SVar8;
  RGB local_a8;
  Tuple2<pbrt::Point2,_float> local_98;
  ImageInfiniteLight *local_80;
  SampledWavelengths *local_78;
  WrapMode2D local_70;
  RGB local_68;
  SampledSpectrum local_58;
  RGBIlluminantSpectrum local_48;
  
  local_a8.r = 0.0;
  local_a8.g = 0.0;
  local_a8.b = 0.0;
  local_98 = uv.super_Tuple2<pbrt::Point2,_float>;
  local_80 = this;
  local_78 = lambda;
  for (c_00 = 0; c_00 != 3; c_00 = c_00 + 1) {
    WrapMode2D::WrapMode2D(&local_70,OctahedralSphere);
    FVar3 = Image::LookupNearestChannel(&this->image,(Point2f)local_98,c_00,local_70);
    pRVar2 = &local_a8;
    if ((c_00 != 0) && (pRVar2 = (RGB *)&local_a8.g, c_00 != 1)) {
      pRVar2 = (RGB *)&local_a8.b;
    }
    pRVar2->r = FVar3;
  }
  auVar6 = (undefined1  [56])0x0;
  cs = local_80->imageColorSpace;
  local_98.x = local_80->scale;
  RVar7 = ClampZero(&local_a8);
  local_68.b = RVar7.b;
  auVar4._0_8_ = RVar7._0_8_;
  auVar4._8_56_ = auVar6;
  local_68._0_8_ = vmovlps_avx(auVar4._0_16_);
  RGBIlluminantSpectrum::RGBIlluminantSpectrum(&local_48,cs,&local_68);
  SVar8 = RGBIlluminantSpectrum::Sample(&local_48,local_78);
  auVar5._0_8_ = SVar8.values.values._0_8_;
  auVar5._8_56_ = auVar6;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = SVar8.values.values._8_8_;
  local_58.values.values = (array<float,_4>)vmovlhps_avx(auVar5._0_16_,auVar1);
  SVar8 = SampledSpectrum::operator*(&local_58,local_98.x);
  return (array<float,_4>)(array<float,_4>)SVar8;
}

Assistant:

Le(Point2f uv, const SampledWavelengths &lambda) const {
        RGB rgb;
        for (int c = 0; c < 3; ++c)
            rgb[c] = image.LookupNearestChannel(uv, c, WrapMode::OctahedralSphere);
        return scale *
               RGBIlluminantSpectrum(*imageColorSpace, ClampZero(rgb)).Sample(lambda);
    }